

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void * UnityNumToPtr(UNITY_INT num,UNITY_UINT8 size)

{
  anon_union_8_6_f0d708e3 aVar1;
  UNITY_UINT8 size_local;
  UNITY_INT num_local;
  
  if (size == '\x01') {
    UnityQuickCompare.i8 = (char)num;
    aVar1 = UnityQuickCompare;
  }
  else if (size == '\x02') {
    UnityQuickCompare.i16 = (short)num;
    aVar1 = UnityQuickCompare;
  }
  else {
    aVar1 = (anon_union_8_6_f0d708e3)num;
    if (size != '\b') {
      UnityQuickCompare.i32 = (int)num;
      aVar1 = UnityQuickCompare;
    }
  }
  UnityQuickCompare = aVar1;
  return &UnityQuickCompare;
}

Assistant:

UNITY_INTERNAL_PTR UnityNumToPtr(const UNITY_INT num, const UNITY_UINT8 size)
{
    switch(size)
    {
        case 1:
          UnityQuickCompare.i8 = (UNITY_INT8)num;
          return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i8);

        case 2:
          UnityQuickCompare.i16 = (UNITY_INT16)num;
          return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i16);

#ifdef UNITY_SUPPORT_64
        case 8:
          UnityQuickCompare.i64 = (UNITY_INT64)num;
          return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i64);
#endif
        default: /* 4 bytes */
          UnityQuickCompare.i32 = (UNITY_INT32)num;
          return (UNITY_INTERNAL_PTR)(&UnityQuickCompare.i32);
    }
}